

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void MAFSA_automaton_search_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_letter delim,MAFSA_automaton_string_handler fetcher)

{
  uint32_t uVar1;
  MAFSA_automaton in_RCX;
  uint uVar2;
  MAFSA_automaton_string_handler in_RDX;
  long in_RSI;
  long *in_RDI;
  uint32_t *in_R8;
  MAFSA_stack_struct *in_R9;
  MAFSA_letter label;
  MAFSA_stack_struct tmp_stack;
  uint32_t where;
  uint32_t current;
  uint32_t i;
  ssize_t cur_pos;
  MAFSA_letter label_00;
  uint32_t state;
  undefined4 uVar3;
  uint uVar4;
  MAFSA_automaton_string_handler fetcher_00;
  uint32_t *puVar5;
  MAFSA_automaton ma_00;
  
  fetcher_00 = (MAFSA_automaton_string_handler)0x0;
  do {
    if (in_RDX <= fetcher_00) {
      return;
    }
    uVar3 = *(undefined4 *)*in_RDI;
    uVar4 = (uint)fetcher_00;
    puVar5 = in_R8;
    ma_00 = in_RCX;
    while ((MAFSA_automaton_string_handler)(ulong)uVar4 <= in_RDX) {
      state = (uint32_t)((ulong)in_RCX >> 0x20);
      label_00 = (MAFSA_letter)((ulong)in_RCX >> 0x18);
      uVar1 = MAFSA_delta(in_R8,state,label_00);
      if (uVar1 != 0) {
        stack_push((MAFSA_stack_struct *)&stack0xffffffffffffffa0,(MAFSA_letter)tmp_stack.buffer);
        enumerate(ma_00,(uint32_t)((ulong)puVar5 >> 0x20),in_R9,fetcher_00,
                  (void *)CONCAT44(uVar4,uVar3));
        stack_pop((MAFSA_stack_struct *)&stack0xffffffffffffffa0);
      }
      uVar2 = uVar4 + 1;
      stack_push((MAFSA_stack_struct *)&stack0xffffffffffffffa0,
                 *(MAFSA_letter *)(in_RSI + (ulong)uVar4));
      uVar1 = MAFSA_delta(in_R8,state,label_00);
      if (uVar1 == 0) break;
      uVar3 = *(undefined4 *)(*in_RDI + (ulong)uVar1 * 4);
      uVar4 = uVar2;
    }
    fetcher_00 = fetcher_00 + 1;
    in_R8 = puVar5;
    in_RCX = ma_00;
  } while( true );
}

Assistant:

extern void MAFSA_automaton_search_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_letter delim, MAFSA_automaton_string_handler fetcher)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; ++cur_pos)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        struct MAFSA_stack_struct tmp_stack;

        tmp_stack.buffer   = tmp;
        tmp_stack.reserved = sz_tmp;
        tmp_stack.current  = -1;

        while (i <= sz_l)
        {
            MAFSA_letter label;

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
            {
                stack_push(&tmp_stack, delim);
                enumerate(ma, ma->ptr_nodes[where], &tmp_stack, fetcher, user_data);
                stack_pop(&tmp_stack);
            }

            label = l[i++];
            stack_push(&tmp_stack, label);

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }
    }
}